

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,StringPiece filename,DescriptorProto *message_type)

{
  Rep *pRVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  void **ppvVar5;
  bool bVar6;
  
  pRVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar3 = (long)(message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar3 != 0) {
    lVar4 = 0;
    do {
      bVar2 = AddNestedExtensions<google::protobuf::DescriptorProto>
                        (this,filename,*(DescriptorProto **)((long)ppvVar5 + lVar4));
      if (!bVar2) {
        return false;
      }
      lVar4 = lVar4 + 8;
    } while (lVar3 * 8 != lVar4);
  }
  pRVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar3 = (long)(message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar3 == 0) {
    bVar2 = true;
  }
  else {
    lVar4 = 0;
    do {
      bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,*(FieldDescriptorProto **)((long)ppvVar5 + lVar4));
      if (!bVar2) {
        return bVar2;
      }
      bVar6 = lVar3 * 8 + -8 != lVar4;
      lVar4 = lVar4 + 8;
    } while (bVar6);
  }
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    StringPiece filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}